

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O0

void rr::(anonymous_namespace)::
     drawBasicPrimitives<std::vector<rr::pa::Triangle,std::allocator<rr::pa::Triangle>>>
               (RenderState *state,RenderTarget *renderTarget,Program *program,
               vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> *primList,
               VertexPacketAllocator *vpalloc)

{
  bool bVar1;
  bool clipZ;
  VertexPacketAllocator *vpalloc_local;
  vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_> *primList_local;
  Program *program_local;
  RenderTarget *renderTarget_local;
  RenderState *state_local;
  
  bVar1 = (state->fragOps).depthClampEnabled;
  flatshadeVertices<std::vector<rr::pa::Triangle,std::allocator<rr::pa::Triangle>>>
            (program,primList);
  anon_unknown_19::clipPrimitives(primList,program,(bool)((bVar1 ^ 0xffU) & 1),vpalloc);
  transformClipCoordsToWindowCoords<std::vector<rr::pa::Triangle,std::allocator<rr::pa::Triangle>>>
            (state,primList);
  rasterize<std::vector<rr::pa::Triangle,std::allocator<rr::pa::Triangle>>>
            (state,renderTarget,program,primList);
  return;
}

Assistant:

void drawBasicPrimitives (const RenderState& state, const RenderTarget& renderTarget, const Program& program, ContainerType& primList, VertexPacketAllocator& vpalloc)
{
	const bool clipZ = !state.fragOps.depthClampEnabled;

	// Transform feedback

	// Flatshading
	flatshadeVertices(program, primList);

	// Clipping
	// \todo [jarkko] is creating & swapping std::vectors really a good solution?
	clipPrimitives(primList, program, clipZ, vpalloc);

	// Transform vertices to window coords
	transformClipCoordsToWindowCoords(state, primList);

	// Rasterize and paint
	rasterize(state, renderTarget, program, primList);
}